

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_fop_QQQ(DisasContext_conflict8 *dc,int rd,int rs1,int rs2,
                _func_void_TCGContext_ptr_TCGv_ptr_conflict *gen)

{
  TCGContext_conflict8 *tcg_ctx_00;
  TCGContext_conflict8 *tcg_ctx;
  _func_void_TCGContext_ptr_TCGv_ptr_conflict *gen_local;
  int rs2_local;
  int rs1_local;
  int rd_local;
  DisasContext_conflict8 *dc_local;
  
  tcg_ctx_00 = dc->uc->tcg_ctx;
  gen_op_load_fpr_QT0(tcg_ctx_00,(rs1 & 1U) << 5 | rs1 & 0x1cU);
  gen_op_load_fpr_QT1(tcg_ctx_00,(rs2 & 1U) << 5 | rs2 & 0x1cU);
  (*gen)(tcg_ctx_00,tcg_ctx_00->cpu_env);
  gen_helper_check_ieee_exceptions(tcg_ctx_00,(TCGv_i32)tcg_ctx_00->cpu_fsr,tcg_ctx_00->cpu_env);
  gen_op_store_QT0_fpr(tcg_ctx_00,(rd & 1U) << 5 | rd & 0x1cU);
  gen_update_fprs_dirty(dc,(rd & 1U) << 5 | rd & 0x1cU);
  return;
}

Assistant:

static inline void gen_fop_QQQ(DisasContext *dc, int rd, int rs1, int rs2,
                               void (*gen)(TCGContext *, TCGv_ptr))
{
    TCGContext *tcg_ctx = dc->uc->tcg_ctx;
    gen_op_load_fpr_QT0(tcg_ctx, QFPREG(rs1));
    gen_op_load_fpr_QT1(tcg_ctx, QFPREG(rs2));

    gen(tcg_ctx, tcg_ctx->cpu_env);
    gen_helper_check_ieee_exceptions(tcg_ctx, tcg_ctx->cpu_fsr, tcg_ctx->cpu_env);

    gen_op_store_QT0_fpr(tcg_ctx, QFPREG(rd));
    gen_update_fprs_dirty(dc, QFPREG(rd));
}